

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O2

Vec_Ptr_t * Gia_ManMultiProveAig(Aig_Man_t *p,Bmc_MulPar_t *pPars)

{
  int nTotalPo;
  uint uVar1;
  int nTotalSize;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime clkStart;
  abctime aVar5;
  Vec_Int_t *vOutMap;
  Vec_Ptr_t *p_00;
  void **__s;
  Vec_Int_t *pVVar6;
  Aig_Man_t *pAVar7;
  char *pFileName;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int fVerbose;
  long lVar11;
  Saig_ParBmc_t *p_01;
  int *pPos;
  Vec_Ptr_t *p_02;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  uint local_16c;
  Ssw_RarPars_t ParsSim;
  Saig_ParBmc_t ParsBmc;
  
  clkStart = Abc_Clock();
  if (pPars->TimeOutGlo == 0) {
    lVar11 = 0;
    lVar9 = 0;
  }
  else {
    aVar5 = Abc_Clock();
    lVar11 = (long)pPars->TimeOutGlo;
    lVar9 = lVar11 * 1000000 + aVar5;
  }
  nTotalPo = p->nTruePos;
  local_16c = pPars->TimeOutLoc;
  nTotalSize = p->vObjs->nSize - p->nDeleted;
  if ((pPars->fVerbose != 0) &&
     (printf("MultiProve parameters: Global timeout = %d sec.  Local timeout = %d sec.  Time increase = %d %%.\n"
             ,lVar11,(ulong)local_16c,(ulong)(uint)pPars->TimeOutInc), pPars->fVerbose != 0)) {
    printf("Gap timout = %d sec. Per-output timeout = %d msec. Use synthesis = %d. Dump final = %d. Verbose = %d.\n"
           ,(ulong)(uint)pPars->TimeOutGap,(ulong)(uint)pPars->TimePerOut,
           (ulong)(uint)pPars->fUseSyn,(ulong)(uint)pPars->fDumpFinal);
  }
  uVar10 = p->nTruePos;
  vOutMap = Vec_IntAlloc(uVar10);
  vOutMap->nSize = uVar10;
  uVar8 = 0;
  uVar12 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar12 = uVar8;
  }
  for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
    vOutMap->pArray[uVar8] = (int)uVar8;
  }
  iVar13 = p->nTruePos;
  p_00 = (Vec_Ptr_t *)malloc(0x10);
  iVar2 = 8;
  if (6 < iVar13 - 1U) {
    iVar2 = iVar13;
  }
  p_00->nCap = iVar2;
  if (iVar2 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar2 << 3);
  }
  p_00->pArray = __s;
  p_00->nSize = iVar13;
  memset(__s,0,(long)iVar13 << 3);
  iVar13 = 1000;
  uVar10 = 0;
  do {
    bVar14 = iVar13 == 0;
    iVar13 = iVar13 + -1;
    if (bVar14) {
LAB_004b2dc4:
      Vec_IntFree(vOutMap);
      if (pPars->fVerbose != 0) {
        uVar10 = Gia_ManCountConst0Pos(p);
        printf("The number of POs proved UNSAT by synthesis = %d.\n",(ulong)uVar10);
      }
      if (pPars->fDumpFinal != 0) {
        pFileName = Extra_FileNameGenericAppend(p->pName,"_out.aig");
        Ioa_WriteAiger(p,pFileName,0,0);
        printf("Final AIG was dumped into file \"%s\".\n",pFileName);
      }
      Aig_ManStop(p);
      return p_00;
    }
    iVar2 = Vec_PtrCountZero(p_00);
    Ssw_RarSetDefaultParams(&ParsSim);
    ParsSim.fSolveAll = 1;
    ParsSim.fSilent = (int)(pPars->fVeryVerbose == 0);
    ParsSim.TimeOut = local_16c;
    ParsSim.nWords = 5;
    ParsSim.nRandSeed = uVar10 % 500;
    ParsSim.fNotVerbose = ParsSim.fSolveAll;
    Ssw_RarSimulate(p,&ParsSim);
    if (p->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      pVVar6 = Gia_ManProcessOutputs(p->vSeqModelVec,p_00,vOutMap);
      if (pVVar6->nSize == 0) goto LAB_004b2dc4;
      pAVar7 = Saig_ManDupCones(p,pVVar6->pArray,pVVar6->nSize);
      Vec_IntFree(pVVar6);
      Aig_ManStop(p);
      p = pAVar7;
    }
    if (pPars->fVerbose != 0) {
      Gia_ManMultiReport(p,"SIM",nTotalPo,nTotalSize,clkStart);
    }
    if ((lVar9 != 0) && (aVar5 = Abc_Clock(), lVar9 < (long)(int)local_16c * 1000000 + aVar5)) {
LAB_004b2d8e:
      printf("Global timeout (%d sec) is reached.\n",(ulong)(uint)pPars->TimeOutGlo);
      goto LAB_004b2dc4;
    }
    p_01 = &ParsBmc;
    Saig_ParBmcSetDefaultParams(p_01);
    ParsBmc.fSolveAll = 1;
    ParsBmc.fSilent = (int)(pPars->fVeryVerbose == 0);
    ParsBmc.nTimeOut = local_16c;
    ParsBmc.nTimeOutOne = pPars->TimePerOut;
    ParsBmc.fNotVerbose = ParsBmc.fSolveAll;
    Saig_ManBmcScalable(p,p_01);
    fVerbose = (int)p_01;
    iVar3 = extraout_EDX;
    if (pPars->fVeryVerbose != 0) {
      uVar1 = p->nTruePos;
      p_02 = p->vSeqModelVec;
      iVar3 = Vec_PtrCountZero(p_02);
      fVerbose = 0x8249af;
      Abc_Print((int)p_02,"Some outputs are SAT (%d out of %d) after %d frames.\n",
                (ulong)(uVar1 - iVar3),(ulong)uVar1,(ulong)(uint)ParsBmc.iFrame);
      iVar3 = extraout_EDX_00;
    }
    pAVar7 = p;
    if (p->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      pVVar6 = Gia_ManProcessOutputs(p->vSeqModelVec,p_00,vOutMap);
      if (pVVar6->nSize == 0) goto LAB_004b2dc4;
      pPos = pVVar6->pArray;
      pAVar7 = Saig_ManDupCones(p,pPos,pVVar6->nSize);
      fVerbose = (int)pPos;
      Vec_IntFree(pVVar6);
      Aig_ManStop(p);
      iVar3 = extraout_EDX_01;
    }
    if (pPars->fVerbose != 0) {
      fVerbose = 0x8249e5;
      Gia_ManMultiReport(pAVar7,"BMC",nTotalPo,nTotalSize,clkStart);
      iVar3 = extraout_EDX_02;
    }
    p = pAVar7;
    if ((lVar9 != 0) &&
       (aVar5 = Abc_Clock(), iVar3 = extraout_EDX_03, lVar9 < (long)(int)local_16c * 1000000 + aVar5
       )) goto LAB_004b2d8e;
    uVar1 = pPars->TimeOutGap;
    if (((uVar1 != 0) && ((int)uVar1 <= (int)local_16c)) &&
       (iVar4 = Vec_PtrCountZero(p_00), iVar3 = extraout_EDX_04, iVar2 == iVar4)) {
      printf("Gap timeout (%d sec) is reached.\n",(ulong)uVar1);
      goto LAB_004b2dc4;
    }
    if (pPars->fUseSyn != 0) {
      p = Gia_ManMultiProveSyn(pAVar7,fVerbose,iVar3);
      Aig_ManStop(pAVar7);
      if (pPars->fVerbose != 0) {
        Gia_ManMultiReport(p,"SYN",nTotalPo,nTotalSize,clkStart);
      }
    }
    local_16c = local_16c + (int)(pPars->TimeOutInc * local_16c) / 100;
    uVar10 = uVar10 + 0x11;
  } while( true );
}

Assistant:

Vec_Ptr_t * Gia_ManMultiProveAig( Aig_Man_t * p, Bmc_MulPar_t * pPars )
{
    Ssw_RarPars_t ParsSim, * pParsSim = &ParsSim;
    Saig_ParBmc_t ParsBmc, * pParsBmc = &ParsBmc;
    Vec_Int_t * vOutMap, * vLeftOver;
    Vec_Ptr_t * vCexes;
    Aig_Man_t * pTemp;
    abctime clkStart = Abc_Clock();
    abctime nTimeToStop = pPars->TimeOutGlo ? Abc_Clock() + pPars->TimeOutGlo * CLOCKS_PER_SEC : 0;
    int nTotalPo     = Saig_ManPoNum(p);
    int nTotalSize   = Aig_ManObjNum(p);
    int TimeOutLoc   = pPars->TimeOutLoc;
    int i, RetValue  = -1;
    if ( pPars->fVerbose )
        printf( "MultiProve parameters: Global timeout = %d sec.  Local timeout = %d sec.  Time increase = %d %%.\n", 
            pPars->TimeOutGlo, pPars->TimeOutLoc, pPars->TimeOutInc );
    if ( pPars->fVerbose )
        printf( "Gap timout = %d sec. Per-output timeout = %d msec. Use synthesis = %d. Dump final = %d. Verbose = %d.\n", 
            pPars->TimeOutGap, pPars->TimePerOut, pPars->fUseSyn, pPars->fDumpFinal, pPars->fVerbose );
    // create output map
    vOutMap = Vec_IntStartNatural( Saig_ManPoNum(p) ); // maps current outputs into their original IDs
    vCexes  = Vec_PtrStart( Saig_ManPoNum(p) );        // maps solved outputs into their CEXes (or markers)
    for ( i = 0; i < 1000; i++ )
    {
        int nSolved = Vec_PtrCountZero(vCexes);
        // perform SIM3
        Ssw_RarSetDefaultParams( pParsSim );
        pParsSim->fSolveAll = 1;
        pParsSim->fNotVerbose = 1;
        pParsSim->fSilent = !pPars->fVeryVerbose;
        pParsSim->TimeOut = TimeOutLoc;
        pParsSim->nRandSeed = (i * 17) % 500;
        pParsSim->nWords = 5;
        RetValue *= Ssw_RarSimulate( p, pParsSim );
        // sort outputs
        if ( p->vSeqModelVec )
        {
            vLeftOver = Gia_ManProcessOutputs( p->vSeqModelVec, vCexes, vOutMap );
            if ( Vec_IntSize(vLeftOver) == 0 )
                break;
            // remove solved        
            p = Saig_ManDupCones( pTemp = p, Vec_IntArray(vLeftOver), Vec_IntSize(vLeftOver) );
            Vec_IntFree( vLeftOver );
            Aig_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
            Gia_ManMultiReport( p, "SIM", nTotalPo, nTotalSize, clkStart );

        // check timeout
        if ( nTimeToStop && Abc_Clock() + TimeOutLoc * CLOCKS_PER_SEC > nTimeToStop )
        {
            printf( "Global timeout (%d sec) is reached.\n", pPars->TimeOutGlo );
            break;
        }

        // perform BMC
        Saig_ParBmcSetDefaultParams( pParsBmc );
        pParsBmc->fSolveAll = 1;
        pParsBmc->fNotVerbose = 1;
        pParsBmc->fSilent = !pPars->fVeryVerbose;
        pParsBmc->nTimeOut = TimeOutLoc;
        pParsBmc->nTimeOutOne = pPars->TimePerOut;
        RetValue *= Saig_ManBmcScalable( p, pParsBmc );
        if ( pPars->fVeryVerbose )
            Abc_Print( 1, "Some outputs are SAT (%d out of %d) after %d frames.\n", 
                Saig_ManPoNum(p) - Vec_PtrCountZero(p->vSeqModelVec), Saig_ManPoNum(p), pParsBmc->iFrame );
        // sort outputs
        if ( p->vSeqModelVec )
        {
            vLeftOver = Gia_ManProcessOutputs( p->vSeqModelVec, vCexes, vOutMap );
            if ( Vec_IntSize(vLeftOver) == 0 )
                break;
            // remove solved        
            p = Saig_ManDupCones( pTemp = p, Vec_IntArray(vLeftOver), Vec_IntSize(vLeftOver) );
            Vec_IntFree( vLeftOver );
            Aig_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
            Gia_ManMultiReport( p, "BMC", nTotalPo, nTotalSize, clkStart );

        // check timeout
        if ( nTimeToStop && Abc_Clock() + TimeOutLoc * CLOCKS_PER_SEC > nTimeToStop )
        {
            printf( "Global timeout (%d sec) is reached.\n", pPars->TimeOutGlo );
            break;
        }

        // check gap timeout
        if ( pPars->TimeOutGap && pPars->TimeOutGap <= TimeOutLoc && nSolved == Vec_PtrCountZero(vCexes) )
        {
            printf( "Gap timeout (%d sec) is reached.\n", pPars->TimeOutGap );
            break;
        }

        // synthesize
        if ( pPars->fUseSyn )
        {
            p = Gia_ManMultiProveSyn( pTemp = p, pPars->fVerbose, pPars->fVeryVerbose );
            Aig_ManStop( pTemp );
            if ( pPars->fVerbose )
                Gia_ManMultiReport( p, "SYN", nTotalPo, nTotalSize, clkStart );
        }

        // increase timeout
        TimeOutLoc += TimeOutLoc * pPars->TimeOutInc / 100;
    }
    Vec_IntFree( vOutMap );
    if ( pPars->fVerbose )
        printf( "The number of POs proved UNSAT by synthesis = %d.\n", Gia_ManCountConst0Pos(p) );
    if ( pPars->fDumpFinal )
    {
        char * pFileName = Extra_FileNameGenericAppend( p->pName, "_out.aig" );
        Ioa_WriteAiger( p, pFileName, 0, 0 );
        printf( "Final AIG was dumped into file \"%s\".\n", pFileName );
    }
    Aig_ManStop( p );
    return vCexes;
}